

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O2

Value * cmDumpCTestInfo(Value *__return_storage_ptr__,cmake *cm)

{
  cmLocalGenerator *lg;
  cmTest *pcVar1;
  pointer pbVar2;
  bool bVar3;
  Value *pVVar4;
  pointer ppcVar5;
  string *psVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  cmake *cm_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cmd;
  pointer pbVar10;
  pointer value;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  cge_value;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  vector<cmTest_*,_std::allocator<cmTest_*>_> tests_1;
  ValueHolder local_340;
  undefined8 local_338;
  undefined1 local_330 [24];
  cmListFileBacktrace local_318;
  cmake *local_300;
  _Rb_tree_node_base *local_2f8;
  string *local_2f0;
  _Base_ptr local_2e8;
  _Base_ptr local_2e0;
  pointer local_2d8;
  pointer local_2d0;
  cmGeneratorExpression ge;
  string command;
  Value local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  string local_258;
  Value local_238;
  Value local_210;
  Value tests;
  Value pObj;
  Value properties;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value entry;
  Value local_58;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_238,arrayValue);
  local_300 = cm;
  (anonymous_namespace)::getConfigurations_abi_cxx11_(&local_270,(_anonymous_namespace_ *)cm,cm_00);
  local_2f0 = local_270.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  psVar6 = local_270.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  value = local_270.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (value == psVar6) break;
    Json::Value::Value(&local_170,objectValue);
    Json::Value::Value(&local_148,value);
    pVVar4 = Json::Value::operator[](&local_170,&kNAME_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar4,&local_148);
    Json::Value::~Value(&local_148);
    Json::Value::Value(&local_210,arrayValue);
    p_Var8 = (local_300->GlobalGenerator->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
    local_2f8 = &(local_300->GlobalGenerator->ProjectMap)._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
    while( true ) {
      if (p_Var8 == local_2f8) break;
      Json::Value::Value(&pObj,objectValue);
      Json::Value::Value(&local_f8,(string *)(p_Var8 + 1));
      pVVar4 = Json::Value::operator[](&pObj,&kNAME_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar4,&local_f8);
      Json::Value::~Value(&local_f8);
      Json::Value::Value(&tests,arrayValue);
      local_2e8 = p_Var8[2]._M_parent;
      p_Var9 = *(_Base_ptr *)(p_Var8 + 2);
      while (p_Var9 != local_2e8) {
        cmLocalGenerator::GenerateTestFiles(*(cmLocalGenerator **)p_Var9);
        lg = *(cmLocalGenerator **)p_Var9;
        tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2e0 = p_Var9;
        cmMakefile::GetTests(lg->Makefile,value,&tests_1);
        local_2d8 = tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        ppcVar5 = tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        while (ppcVar5 != local_2d8) {
          pcVar1 = *ppcVar5;
          local_2d0 = ppcVar5;
          Json::Value::Value(&local_298,objectValue);
          std::__cxx11::string::string((string *)&local_340.bool_,(string *)&pcVar1->Name);
          Json::Value::Value(&local_58,(string *)&local_340);
          pVVar4 = Json::Value::operator[](&local_298,&kCTEST_NAME_abi_cxx11_);
          Json::Value::operator=(pVVar4,&local_58);
          Json::Value::~Value(&local_58);
          std::__cxx11::string::~string((string *)&local_340.bool_);
          command._M_dataplus._M_p = (pointer)&command.field_2;
          command._M_string_length = 0;
          command.field_2._M_local_buf[0] = '\0';
          pbVar2 = (pcVar1->Command).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar10 = (pcVar1->Command).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
              pbVar10 = pbVar10 + 1) {
            std::__cxx11::string::append((string *)&command);
            std::__cxx11::string::append((char *)&command);
          }
          local_318.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_318.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          cmGeneratorExpression::cmGeneratorExpression(&ge,&local_318);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_318.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
          local_340.string_ = local_330;
          local_338 = 0;
          local_330[0] = 0;
          psVar6 = cmCompiledGeneratorExpression::Evaluate
                             ((cmCompiledGeneratorExpression *)
                              cge._M_t.
                              super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                              .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                              _M_head_impl,lg,value,false,(cmGeneratorTarget *)0x0,
                              (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                              (string *)&local_340);
          std::__cxx11::string::~string((string *)&local_340.bool_);
          Json::Value::Value((Value *)&local_340,psVar6);
          pVVar4 = Json::Value::operator[](&local_298,&kCTEST_COMMAND_abi_cxx11_);
          Json::Value::operator=(pVVar4,(Value *)&local_340);
          Json::Value::~Value((Value *)&local_340);
          Json::Value::Value(&properties,arrayValue);
          for (p_Var7 = (pcVar1->Properties).
                        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                        ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var7 !=
              &(pcVar1->Properties).
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
               ._M_t._M_impl.super__Rb_tree_header;
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
            Json::Value::Value(&entry,objectValue);
            Json::Value::Value(&local_a8,(string *)(p_Var7 + 1));
            pVVar4 = Json::Value::operator[](&entry,&kKEY_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar4,&local_a8);
            Json::Value::~Value(&local_a8);
            cmProperty::GetValue((cmProperty *)(p_Var7 + 2));
            cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge_value,(char *)&ge);
            local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
            local_258._M_string_length = 0;
            local_258.field_2._M_local_buf[0] = '\0';
            psVar6 = cmCompiledGeneratorExpression::Evaluate
                               ((cmCompiledGeneratorExpression *)
                                cge_value._M_t.
                                super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                _M_head_impl,lg,value,false,(cmGeneratorTarget *)0x0,
                                (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                                &local_258);
            std::__cxx11::string::~string((string *)&local_258);
            Json::Value::Value(&local_d0,psVar6);
            pVVar4 = Json::Value::operator[](&entry,&kVALUE_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar4,&local_d0);
            Json::Value::~Value(&local_d0);
            Json::Value::append(&properties,&entry);
            std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::~unique_ptr(&cge_value);
            Json::Value::~Value(&entry);
          }
          Json::Value::Value(&entry,&properties);
          pVVar4 = Json::Value::operator[](&local_298,&kPROPERTIES_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar4,&entry);
          Json::Value::~Value(&entry);
          Json::Value::~Value(&properties);
          std::
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          ::~unique_ptr(&cge);
          cmGeneratorExpression::~cmGeneratorExpression(&ge);
          std::__cxx11::string::~string((string *)&command);
          bVar3 = Json::Value::isNull(&local_298);
          if (!bVar3) {
            Json::Value::append(&tests,&local_298);
          }
          Json::Value::~Value(&local_298);
          ppcVar5 = local_2d0 + 1;
        }
        std::_Vector_base<cmTest_*,_std::allocator<cmTest_*>_>::~_Vector_base
                  (&tests_1.super__Vector_base<cmTest_*,_std::allocator<cmTest_*>_>);
        psVar6 = local_2f0;
        p_Var9 = (_Base_ptr)&local_2e0->_M_parent;
      }
      Json::Value::Value(&local_120,&tests);
      pVVar4 = Json::Value::operator[](&pObj,&kCTEST_INFO_abi_cxx11_);
      Json::Value::operator=(pVVar4,&local_120);
      Json::Value::~Value(&local_120);
      Json::Value::append(&local_210,&pObj);
      Json::Value::~Value(&tests);
      Json::Value::~Value(&pObj);
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    }
    pVVar4 = Json::Value::operator[](&local_170,&kPROJECTS_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar4,&local_210);
    Json::Value::~Value(&local_210);
    Json::Value::append(&local_238,&local_170);
    Json::Value::~Value(&local_170);
    value = value + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_270);
  pVVar4 = Json::Value::operator[](__return_storage_ptr__,&kCONFIGURATIONS_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar4,&local_238);
  Json::Value::~Value(&local_238);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmDumpCTestInfo(const cmake* cm)
{
  Json::Value result = Json::objectValue;
  result[kCONFIGURATIONS_KEY] = DumpCTestConfigurationsList(cm);
  return result;
}